

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffBoundsImp<4>::filterlower(AllDiffBoundsImp<4> *this)

{
  interval *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  interval *piVar6;
  IntVar *pIVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  int l_1;
  int l;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar18;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  long lVar19;
  int iVar20;
  int iVar21;
  AllDiffBoundsImp<4> *local_88;
  long local_80;
  long local_78;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar17;
  
  if (-1 < this->nb) {
    piVar12 = this->bounds;
    piVar2 = this->t;
    piVar3 = this->h;
    piVar4 = this->d;
    piVar5 = this->bucket;
    lVar18 = 0;
    do {
      iVar11 = piVar12[lVar18 + 1];
      piVar3[lVar18 + 1] = (int)lVar18;
      piVar2[lVar18 + 1] = (int)lVar18;
      piVar4[lVar18 + 1] = iVar11 - piVar12[lVar18];
      piVar5[lVar18 + 1] = -1;
      lVar18 = lVar18 + 1;
    } while (lVar18 <= this->nb);
  }
  if (0 < this->sz) {
    lVar18 = 0;
    do {
      piVar6 = this->iv;
      piVar12 = this->maxsorted;
      piVar1 = piVar6 + piVar12[lVar18];
      local_64 = piVar1->minrank;
      local_60 = piVar1->maxrank;
      local_50 = (long)local_60;
      piVar2 = this->t;
      iVar15 = local_64 + 1;
      iVar11 = iVar15;
      do {
        iVar20 = iVar11;
        iVar11 = piVar2[iVar20];
      } while (iVar20 < iVar11);
      piVar3 = this->bucket;
      piVar1->next = piVar3[iVar20];
      piVar3[iVar20] = piVar12[lVar18];
      piVar12 = this->d + iVar20;
      *piVar12 = *piVar12 + -1;
      if (*piVar12 == 0) {
        piVar2[iVar20] = iVar20 + 1;
        iVar21 = iVar20 + 1;
        do {
          iVar20 = iVar21;
          iVar21 = piVar2[iVar20];
        } while (iVar20 < piVar2[iVar20]);
        piVar2[iVar20] = iVar11;
      }
      while (iVar15 != iVar20) {
        iVar21 = piVar2[iVar15];
        piVar2[iVar15] = iVar20;
        iVar15 = iVar21;
      }
      iVar15 = this->h[local_64];
      if (local_64 < iVar15) {
        piVar12 = this->bounds;
        do {
          iVar21 = iVar15;
          lVar19 = (long)iVar21;
          iVar15 = this->h[lVar19];
        } while (iVar21 < iVar15);
        local_68 = piVar12[lVar19];
        local_80 = (long)local_68;
        if (so.lazy == true) {
          iVar15 = piVar12[local_64];
          lVar13 = lVar19;
          if (iVar15 < local_68) {
            do {
              uVar9 = piVar3[lVar13];
              while (-1 < (int)uVar9) {
                uVar16 = (ulong)uVar9;
                uVar17 = (ulong)uVar9;
                uVar9 = piVar6[uVar16].next;
                if (piVar6[uVar17].min < iVar15) {
                  iVar15 = piVar6[uVar17].min;
                }
              }
              lVar8 = lVar13 + -1;
              lVar13 = lVar13 + -1;
            } while (iVar15 < piVar12[lVar8]);
          }
          iVar14 = local_68 - iVar15;
          local_78 = lVar19;
          local_88 = (AllDiffBoundsImp<4> *)malloc((long)(iVar14 * 2) * 4 + 0x14);
          *(uint *)&(local_88->super_Propagator)._vptr_Propagator = iVar14 * 0x200 + 0x302;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_88);
          local_70._pt = (Clause *)local_88;
          local_38 = (long)iVar15;
          pIVar7 = this->x[this->maxsorted[lVar18]].var;
          uVar9 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar7,local_38 - this->x[this->maxsorted[lVar18]].b,2);
          r = local_70;
          if (*(uint *)local_70._pt < 0x200) goto LAB_00157391;
          *(uint *)(local_70._a + 8) = uVar9 ^ 1;
          piVar12 = this->bounds;
          if (iVar15 < piVar12[local_78]) {
            local_40 = local_80 + -1;
            iVar14 = 3;
            lVar19 = local_78;
            local_5c = iVar21;
            local_58 = iVar20;
            local_54 = iVar11;
            local_48 = lVar18;
            do {
              uVar9 = this->bucket[lVar19];
              lVar13 = lVar19;
              if (-1 < (int)uVar9) {
                lVar18 = (long)iVar14 + 1;
                local_78 = lVar19;
                do {
                  local_70._pt = (Clause *)(lVar18 + -1);
                  pIVar7 = this->x[uVar9].var;
                  uVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar7,local_38 - this->x[uVar9].b,2);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= (long)local_70._pt) goto LAB_00157391;
                  (r._pt)->data[lVar18 + -1].x = uVar10 ^ 1;
                  pIVar7 = this->x[uVar9].var;
                  uVar10 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                                     (pIVar7,local_40 - this->x[uVar9].b,3);
                  if ((long)(ulong)(*(uint *)r._pt >> 8) <= lVar18) goto LAB_00157391;
                  (r._pt)->data[lVar18].x = uVar10 ^ 1;
                  uVar9 = this->iv[uVar9].next;
                  lVar18 = lVar18 + 2;
                  iVar14 = iVar14 + 2;
                } while (-1 < (int)uVar9);
                piVar12 = this->bounds;
                lVar13 = local_78;
                lVar18 = local_48;
                iVar11 = local_54;
                iVar20 = local_58;
                iVar21 = local_5c;
              }
              lVar19 = lVar13 + -1;
            } while (iVar15 < piVar12[lVar13 + -1]);
          }
        }
        else {
          r._pt = (Clause *)0x0;
        }
        lVar19 = local_80;
        uVar9 = (this->b).v;
        if (sat.assigns.data[uVar9] == 0) {
          pIVar7 = this->x[this->maxsorted[lVar18]].var;
          lVar19 = (long)this->x[this->maxsorted[lVar18]].b;
          if ((pIVar7->max).v + lVar19 < local_80) {
            iVar11 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xd])
                               (pIVar7,local_80 - lVar19,2);
            if (0x2ff < *(uint *)r) {
              *(int *)((long)r + 0xc) = iVar11;
              SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)r);
              return sat.confl == (Clause *)0x0;
            }
            goto LAB_00157391;
          }
        }
        else {
          if (*(uint *)r < 0x300) {
LAB_00157391:
            abort();
          }
          *(uint *)((long)r + 0xc) = (uint)((byte)sat.assigns.data[uVar9] < 0xfe) + uVar9 * 2;
          pIVar7 = this->x[this->maxsorted[lVar18]].var;
          iVar15 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar7,local_80 - this->x[this->maxsorted[lVar18]].b,r,1);
          if ((char)iVar15 == '\0') {
            return false;
          }
          piVar12 = this->maxsorted;
          this->iv[piVar12[lVar18]].min = local_68;
          iVar15 = piVar12[lVar18];
          if ((lVar19 < (long)this->x[iVar15].b + (long)((this->x[iVar15].var)->min).v) &&
             ((this->super_Propagator).in_queue == false)) {
            (this->super_Propagator).in_queue = true;
            local_88 = this;
            vec<Propagator_*>::push
                      (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                       (Propagator **)&local_88);
          }
          if (local_64 != iVar21) {
            piVar12 = this->h;
            do {
              iVar15 = piVar12[local_64];
              piVar12[local_64] = iVar21;
              local_64 = iVar15;
            } while (iVar15 != iVar21);
          }
        }
      }
      if (this->d[iVar20] == this->bounds[iVar20] - this->bounds[local_50]) {
        piVar12 = this->h;
        iVar15 = piVar12[local_50];
        while (iVar15 != iVar11 + -1) {
          iVar20 = piVar12[iVar15];
          piVar12[iVar15] = local_60;
          iVar15 = iVar20;
        }
        piVar12[local_50] = iVar11 + -1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->sz);
  }
  return true;
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}